

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

bool __thiscall ON_Buffer::WriteToBinaryArchive(ON_Buffer *this,ON_BinaryArchive *archive)

{
  ON_BUFFER_SEGMENT *pOVar1;
  ulong uVar2;
  bool bVar3;
  ON__UINT32 i;
  size_t sVar4;
  byte bVar5;
  ON_BUFFER_SEGMENT **ppOVar6;
  ulong uVar7;
  size_t count;
  
  i = CRC32(this,0);
  bVar3 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x28100,1,0);
  if (!bVar3) {
    return false;
  }
  bVar3 = ON_BinaryArchive::WriteBigInt(archive,this->m_buffer_size);
  if ((bVar3) && (bVar3 = ON_BinaryArchive::WriteInt(archive,i), bVar3)) {
    ppOVar6 = &this->m_first_segment;
    uVar7 = 0;
    while( true ) {
      pOVar1 = *ppOVar6;
      bVar5 = 1;
      if (pOVar1 == (ON_BUFFER_SEGMENT *)0x0) break;
      uVar2 = this->m_buffer_size;
      if (uVar2 < uVar7 || uVar2 - uVar7 == 0) break;
      if ((pOVar1->m_segment_buffer != (uchar *)0x0) &&
         (sVar4 = pOVar1->m_segment_position1 - pOVar1->m_segment_position0,
         pOVar1->m_segment_position0 <= pOVar1->m_segment_position1 && sVar4 != 0)) {
        count = uVar2 - uVar7;
        if (sVar4 + uVar7 <= uVar2) {
          count = sVar4;
        }
        bVar3 = ON_BinaryArchive::WriteByte(archive,count,pOVar1->m_segment_buffer);
        if (!bVar3) break;
        uVar7 = uVar7 + count;
      }
      ppOVar6 = &pOVar1->m_next_segment;
    }
  }
  else {
    bVar5 = 0;
  }
  bVar3 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  return (bool)(bVar3 & bVar5);
}

Assistant:

bool ON_Buffer::WriteToBinaryArchive( ON_BinaryArchive& archive ) const
{
  // The ON_Buffer::CRC32() calculation will call ON_ERROR if the segment list
  // is not perfect.  The code below that goes through the segments
  // checks for errors so that crashes are avoided, but does not make
  // additional calls to ON_ERROR.
  ON__UINT32 buffer_crc = CRC32(0);

  if ( !archive.BeginWrite3dmChunk(TCODE_OPENNURBS_BUFFER,1,0) )
    return false;

  bool rc = false;
  for(;;)
  {
    if ( !archive.WriteBigInt(m_buffer_size) )
      break;
    if ( !archive.WriteInt(buffer_crc) )
      break;

    bool buffer_rc = true;
    ON__UINT64 size = 0;
    for ( struct ON_BUFFER_SEGMENT* seg = m_first_segment; 
          0 != seg && size < m_buffer_size; 
          seg = seg->m_next_segment 
        )
    {
      if ( 0 == seg->m_segment_buffer )
        continue;
      if ( seg->m_segment_position1 <= seg->m_segment_position0 )
        continue;
      ON__UINT64 seg_size = (seg->m_segment_position1 - seg->m_segment_position0);
      if ( seg_size + size > m_buffer_size )
        seg_size = m_buffer_size - size;
      if ( !archive.WriteByte( (size_t)seg_size, seg->m_segment_buffer ) )
      {
        buffer_rc = false;
        break;
      }
      size += seg_size;
    }
    
    rc = true;
    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;

  return rc;
}